

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O3

int __thiscall H264StreamReader::processSliceNal(H264StreamReader *this,uint8_t *buff)

{
  int *piVar1;
  int64_t *piVar2;
  uint8_t *sliceEnd;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ostream *poVar10;
  SliceUnit slice;
  uint local_ac;
  SliceUnit local_a8;
  
  SliceUnit::SliceUnit(&local_a8);
  sliceEnd = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  iVar4 = deserializeSliceHeader(this,&local_a8,buff,sliceEnd);
  if (iVar4 == 1) {
    iVar4 = 1;
    if ((this->m_isFirstFrame != true) || (bVar3 = findPPSForward(this,buff + 1), !bVar3))
    goto LAB_00187991;
    iVar4 = deserializeSliceHeader(this,&local_a8,buff,sliceEnd);
  }
  if (((iVar4 != 0) || (iVar4 = 0, local_a8.first_mb_in_slice != 0)) ||
     (this->m_fieldFirst != local_a8.bottom_field_flag)) goto LAB_00187991;
  iVar5 = detectPrimaryPicType(this,&local_a8,buff);
  iVar4 = -10;
  if (iVar5 != 0) goto LAB_00187991;
  if ((((local_a8.sps)->frame_mbs_only_flag != 0) && (this->m_forceLsbDiv != 0)) &&
     (((byte)local_a8.pic_order_cnt_lsb & 1) != 0)) {
    if ((this->super_MPEGStreamReader).m_totalFrameNum < 0xfa) {
      this->m_forceLsbDiv = 0;
      poVar10 = (ostream *)&std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "H264 warn: Force frame_mbs_only_flag division invalid detected. Cancel this flag."
                 ,0x51);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"H264 warn: Unexpected pic_order_cnt_lsb value ",0x2e);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,". FrameNum: ",0xc);
      poVar10 = (ostream *)
                std::ostream::operator<<(poVar10,(this->super_MPEGStreamReader).m_totalFrameNum);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," slice type: ",0xd);
      poVar10 = std::operator<<(poVar10,_ZL12sliceTypeStr_rel +
                                        *(int *)(_ZL12sliceTypeStr_rel +
                                                (ulong)local_a8.slice_type * 4));
    }
    std::endl<char,std::char_traits<char>>(poVar10);
    sLastMsg = true;
  }
  if ((local_a8.sps)->pic_order_cnt_type == 2) {
    this->m_frameDepth = 0;
    iVar4 = 0;
  }
  else {
    iVar4 = calcPicOrder(this,&local_a8);
  }
  bVar3 = SliceUnit::isIDR(&local_a8);
  if (bVar3) {
    this->m_frameNum = 0;
    if ((local_a8.sps)->pic_order_cnt_type == 2) {
      this->m_iFramePtsOffset = 0;
    }
    else {
      iVar5 = getIdrPrevFrames(this,buff,
                               (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
      this->m_iFramePtsOffset = iVar5;
      if (iVar5 == -1) {
        iVar4 = -10;
        goto LAB_00187991;
      }
    }
  }
  else {
    iVar5 = this->m_frameNum + 1;
    this->m_frameNum = iVar5;
    if ((local_a8.sps)->pic_order_cnt_type == 2) {
      iVar4 = iVar5;
    }
  }
  uVar9 = iVar4 + this->m_iFramePtsOffset;
  this->m_isFirstFrame = false;
  piVar1 = &(this->super_MPEGStreamReader).m_totalFrameNum;
  *piVar1 = *piVar1 + 1;
  local_ac = uVar9;
  bVar3 = SliceUnit::isIDR(&local_a8);
  iVar4 = *(int *)&(this->super_MPEGStreamReader).field_0xdc;
  if (bVar3) {
    iVar4 = iVar4 + 1;
    *(int *)&(this->super_MPEGStreamReader).field_0xdc = iVar4;
    this->m_picOrderOffset = 0;
  }
  if (iVar4 == 0) {
    if ((this->m_bSliceFound == false) && (local_a8.slice_type == 1)) {
      this->m_bSliceFound = true;
      this->m_picOrderOffset = ~uVar9 + this->m_frameNum;
    }
    else if (this->m_bSliceFound == false) {
      local_ac = this->m_frameNum;
      goto LAB_0018782b;
    }
    uVar9 = uVar9 + this->m_picOrderOffset;
    local_ac = 0;
    if (0 < (int)uVar9) {
      local_ac = uVar9;
    }
  }
LAB_0018782b:
  checkPyramid(this,this->m_frameNum,(int *)&local_ac,
               (bool)(this->super_MPEGStreamReader).field_0xda);
  lVar7 = (this->super_MPEGStreamReader).m_curDts + this->m_lastDtsInc;
  (this->super_MPEGStreamReader).m_curDts = lVar7;
  lVar8 = ((long)(int)local_ac - (long)this->m_frameNum) *
          (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  (this->super_MPEGStreamReader).m_curPts = lVar8 + lVar7;
  if ((0 < lVar8) &&
     (((this->super_MPEGStreamReader).field_0xda != '\x01' ||
      ((this->super_MPEGStreamReader).field_0xdb == '\x01')))) {
    (this->super_MPEGStreamReader).m_curPts = lVar7;
  }
  if (this->m_OffsetMetadataPtsAddr != (uint8_t *)0x0) {
    SEIUnit::updateMetadataPts(this->m_OffsetMetadataPtsAddr,lVar7 / 0xe5b0 + this->m_startPts);
    this->m_OffsetMetadataPtsAddr = (uint8_t *)0x0;
  }
  iVar4 = this->m_lastPicStruct;
  if (iVar4 - 5U < 2) {
    lVar7 = (this->super_MPEGStreamReader).m_pcrIncPerField +
            (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  else if (iVar4 == 7) {
    lVar7 = (this->super_MPEGStreamReader).m_pcrIncPerFrame * 2;
  }
  else if (iVar4 == 8) {
    lVar7 = (this->super_MPEGStreamReader).m_pcrIncPerFrame * 3;
  }
  else {
    lVar7 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  this->m_lastDtsInc = lVar7;
  if ((this->super_MPEGStreamReader).m_removePulldown == true) {
    MPEGStreamReader::checkPulldownSync(&this->super_MPEGStreamReader);
    piVar2 = &(this->super_MPEGStreamReader).m_testPulldownDts;
    *piVar2 = *piVar2 + this->m_lastDtsInc;
    this->m_lastDtsInc = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
  }
  this->m_lastSlicePPS = local_a8.pic_parameter_set_id;
  if (local_a8.pps == (PPSUnit *)0x0) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = (local_a8.pps)->seq_parameter_set_id;
  }
  this->m_lastSliceSPS = uVar6;
  bVar3 = SliceUnit::isIDR(&local_a8);
  this->m_lastSliceIDR = bVar3;
  bVar3 = SliceUnit::isIFrame(&local_a8);
  this->m_lastIFrame = bVar3;
  iVar4 = 0;
LAB_00187991:
  local_a8.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_0023f088;
  if (local_a8.super_NALUnit.m_nalBuffer != (uint8_t *)0x0) {
    operator_delete__(local_a8.super_NALUnit.m_nalBuffer);
  }
  return iVar4;
}

Assistant:

int H264StreamReader::processSliceNal(uint8_t *buff)
{
    SliceUnit slice;
    const uint8_t *sliceEnd = m_bufEnd;

    int nalRez = deserializeSliceHeader(slice, buff, sliceEnd);

    if (nalRez == NALUnit::SPS_OR_PPS_NOT_READY && m_isFirstFrame)
    {
        if (findPPSForward(buff + 1))
            nalRez = deserializeSliceHeader(slice, buff, sliceEnd);
    }

    if (nalRez != 0)
    {
        return nalRez;
    }

    if (slice.first_mb_in_slice != 0)
        return 0;

    if (m_fieldFirst != slice.bottom_field_flag)  // insrease PTS/DTS only for whole frame
        return 0;

    if (detectPrimaryPicType(slice, buff) != 0)
        return NOT_ENOUGH_BUFFER;

    // forceLsbDiv check
    if (slice.getSPS()->frame_mbs_only_flag && m_forceLsbDiv != 0)
    {
        if (slice.pic_order_cnt_lsb % 2 == 1)
        {
            if (m_totalFrameNum < 250)
            {
                m_forceLsbDiv = 0;
                LTRACE(LT_WARN, 2, "H264 warn: Force frame_mbs_only_flag division invalid detected. Cancel this flag.");
            }
            else
            {
                LTRACE(LT_WARN, 2,
                       "H264 warn: Unexpected pic_order_cnt_lsb value "
                           << slice.pic_order_cnt_lsb << ". FrameNum: " << m_totalFrameNum
                           << " slice type: " << sliceTypeStr[slice.slice_type]);
            }
        }
    }

    ////////////////////////////

    int fullPicOrder = 0;
    if (slice.getSPS()->pic_order_cnt_type != 2)
        fullPicOrder = calcPicOrder(slice);
    else
        m_frameDepth = 0;

    if (slice.isIDR())
    {
        // LTRACE(LT_INFO, 2, "got idr slice");
        m_frameNum = 0;
        if (slice.getSPS()->pic_order_cnt_type != 2)
            m_iFramePtsOffset = getIdrPrevFrames(buff, m_bufEnd);
        else
            m_iFramePtsOffset = 0;
        if (m_iFramePtsOffset == -1)
            return NOT_ENOUGH_BUFFER;
    }
    else
    {
        m_frameNum++;
        // m_frameNum = slice.frame_num;

        if (slice.getSPS()->pic_order_cnt_type == 2)
            fullPicOrder = m_frameNum;
    }
    fullPicOrder += m_iFramePtsOffset;

    m_isFirstFrame = false;
    m_totalFrameNum++;

    if (slice.isIDR())
    {
        m_idrSliceCnt++;
        m_picOrderOffset = 0;
    }
    if (m_idrSliceCnt == 0)
    {
        if (!m_bSliceFound && slice.slice_type == SliceUnit::B_TYPE)
        {
            m_bSliceFound = true;
            m_picOrderOffset = m_frameNum - fullPicOrder - 1;
        }
        if (m_bSliceFound)
        {
            fullPicOrder += m_picOrderOffset;
            if (fullPicOrder < 0)
                fullPicOrder = 0;
        }
        else
            fullPicOrder = m_frameNum;
    }

    // check b-pyramid
    checkPyramid(m_frameNum, &fullPicOrder, m_nextFrameFound);

    // increase PTS/DTS
    m_curDts += m_lastDtsInc;
    m_curPts = m_curDts + (fullPicOrder - m_frameNum) * m_pcrIncPerFrame;

    if (m_curPts > m_curDts && (!m_nextFrameFound || m_nextFrameIdr))
        m_curPts = m_curDts;

    if (m_OffsetMetadataPtsAddr)
    {
        const auto pts90k = m_curDts / INT_FREQ_TO_TS_FREQ + m_startPts;
        SEIUnit::updateMetadataPts(m_OffsetMetadataPtsAddr, pts90k);
        m_OffsetMetadataPtsAddr = nullptr;
    }
    // LTRACE(LT_INFO, 2, "delta=" << fullPicOrder - m_frameNum << " m_lastDtsInc=" << m_lastDtsInc);

    if (m_lastPicStruct == 5 || m_lastPicStruct == 6)  // 3 fields per frame. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame + m_pcrIncPerField;
    else if (m_lastPicStruct == 7)  // frame doubling. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame * 2;
    else if (m_lastPicStruct == 8)  // frame tripling. Used in pulldown
        m_lastDtsInc = m_pcrIncPerFrame * 3;
    else
        m_lastDtsInc = m_pcrIncPerFrame;

    if (m_removePulldown)
    {
        checkPulldownSync();
        m_testPulldownDts += m_lastDtsInc;
        m_lastDtsInc = m_pcrIncPerFrame;
    }

    m_lastSlicePPS = slice.pic_parameter_set_id;
    if (slice.getPPS() != nullptr)
        m_lastSliceSPS = slice.getPPS()->seq_parameter_set_id;
    else
        m_lastSliceSPS = -1;
    m_lastSliceIDR = slice.isIDR();
    m_lastIFrame = slice.isIFrame();

    return 0;
}